

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strencodings.h
# Opt level: O2

short LocaleIndependentAtoi<short>(string_view str)

{
  undefined1 auVar1 [16];
  char *pcVar2;
  long in_FS_OFFSET;
  string_view sVar3;
  __integer_from_chars_result_type<short> _Var4;
  string_view local_28;
  short result;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3._M_str = " \f\n\r\t\v";
  sVar3._M_len = 6;
  local_28 = util::TrimStringView(str,sVar3);
  pcVar2 = local_28._M_str;
  if (local_28._M_len == 0) {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = pcVar2;
    sVar3 = (string_view)(auVar1 << 0x40);
LAB_005d46e7:
    _Var4 = std::from_chars<short>(sVar3._M_str,sVar3._M_str + sVar3._M_len,&result,10);
    if (_Var4.ec == 0) goto LAB_005d472d;
    if (_Var4.ec == result_out_of_range) {
      if (local_28._M_len != 0) {
        result = -0x8000;
        if (*local_28._M_str == '-') goto LAB_005d472d;
      }
      result = 0x7fff;
      goto LAB_005d472d;
    }
  }
  else {
    sVar3 = local_28;
    if (*pcVar2 != '+') goto LAB_005d46e7;
    if ((local_28._M_len == 1) || (pcVar2[1] != '-')) {
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                        (&local_28,1,0xffffffffffffffff);
      local_28 = sVar3;
      goto LAB_005d46e7;
    }
  }
  result = 0;
LAB_005d472d:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_10) {
    __stack_chk_fail();
  }
  return result;
}

Assistant:

T LocaleIndependentAtoi(std::string_view str)
{
    static_assert(std::is_integral<T>::value);
    T result;
    // Emulate atoi(...) handling of white space and leading +/-.
    std::string_view s = util::TrimStringView(str);
    if (!s.empty() && s[0] == '+') {
        if (s.length() >= 2 && s[1] == '-') {
            return 0;
        }
        s = s.substr(1);
    }
    auto [_, error_condition] = std::from_chars(s.data(), s.data() + s.size(), result);
    if (error_condition == std::errc::result_out_of_range) {
        if (s.length() >= 1 && s[0] == '-') {
            // Saturate underflow, per strtoll's behavior.
            return std::numeric_limits<T>::min();
        } else {
            // Saturate overflow, per strtoll's behavior.
            return std::numeric_limits<T>::max();
        }
    } else if (error_condition != std::errc{}) {
        return 0;
    }
    return result;
}